

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O0

Literal * __thiscall
wasm::extMul<2ul,int,long,(wasm::LaneOrder)0>
          (Literal *__return_storage_ptr__,wasm *this,Literal *a,Literal *b)

{
  int32_t iVar1;
  int32_t iVar2;
  reference pvVar3;
  reference this_00;
  Literal *val;
  Literal local_148;
  size_type local_130;
  size_t idx;
  size_t i;
  LaneArray<2UL> result;
  undefined1 local_e0 [8];
  LaneArray<2UL_*_2> rhs;
  LaneArray<2UL_*_2> lhs;
  Literal *b_local;
  Literal *a_local;
  
  getLanes<int,4>((LaneArray<4> *)&rhs._M_elems[3].type,this,a);
  getLanes<int,4>((LaneArray<4> *)local_e0,(wasm *)a,val);
  std::array<wasm::Literal,_2UL>::array((array<wasm::Literal,_2UL> *)&i);
  for (idx = 0; idx < 2; idx = idx + 1) {
    local_130 = idx;
    pvVar3 = std::array<wasm::Literal,_4UL>::operator[]
                       ((array<wasm::Literal,_4UL> *)&rhs._M_elems[3].type,idx);
    iVar1 = Literal::geti32(pvVar3);
    pvVar3 = std::array<wasm::Literal,_4UL>::operator[]
                       ((array<wasm::Literal,_4UL> *)local_e0,local_130);
    iVar2 = Literal::geti32(pvVar3);
    Literal::Literal(&local_148,(long)iVar1 * (long)iVar2);
    this_00 = std::array<wasm::Literal,_2UL>::operator[]((array<wasm::Literal,_2UL> *)&i,idx);
    Literal::operator=(this_00,&local_148);
    Literal::~Literal(&local_148);
  }
  Literal::Literal(__return_storage_ptr__,(LaneArray<2> *)&i);
  std::array<wasm::Literal,_2UL>::~array((array<wasm::Literal,_2UL> *)&i);
  std::array<wasm::Literal,_4UL>::~array((array<wasm::Literal,_4UL> *)local_e0);
  std::array<wasm::Literal,_4UL>::~array((array<wasm::Literal,_4UL> *)&rhs._M_elems[3].type);
  return __return_storage_ptr__;
}

Assistant:

Literal extMul(const Literal& a, const Literal& b) {
  LaneArray<Lanes* 2> lhs = getLanes<LaneFrom, Lanes * 2>(a);
  LaneArray<Lanes* 2> rhs = getLanes<LaneFrom, Lanes * 2>(b);
  LaneArray<Lanes> result;
  for (size_t i = 0; i < Lanes; ++i) {
    size_t idx = (Side == LaneOrder::Low) ? i : i + Lanes;
    result[i] = Literal((LaneTo)(LaneFrom)lhs[idx].geti32() *
                        (LaneTo)(LaneFrom)rhs[idx].geti32());
  }
  return Literal(result);
}